

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

type __thiscall
robin_hood::detail::
Table<true,80ul,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,std::shared_ptr<Rml::ElementDefinition_const>,robin_hood::hash<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,void>,std::equal_to<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>>
::
doCreateByKey<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>const&,std::shared_ptr<Rml::ElementDefinition_const>>
          (Table<true,80ul,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,std::shared_ptr<Rml::ElementDefinition_const>,robin_hood::hash<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,void>,std::equal_to<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>>
           *this,vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                 *key)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  pointer ppSVar4;
  pointer ppSVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  size_t sVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_> *this_01;
  ulong insertion_idx;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_> local_58;
  undefined8 local_40;
  undefined8 uStack_38;
  
  while( true ) {
    sVar7 = hash<std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_void>
            ::operator()((hash<std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_void>
                          *)this,key);
    uVar10 = ((uint)sVar7 & 0x1f) >> ((byte)this[0x2c] & 0x3f);
    iVar9 = *(int *)(this + 0x28);
    insertion_idx = sVar7 >> 5 & *(ulong *)(this + 0x18);
    lVar8 = *(long *)(this + 8);
    bVar3 = *(byte *)(lVar8 + insertion_idx);
    while( true ) {
      uVar10 = uVar10 + iVar9;
      if (bVar3 <= uVar10) break;
      bVar3 = *(byte *)(lVar8 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
    }
    if (uVar10 == bVar3) {
      lVar11 = insertion_idx * 0x28;
      do {
        bVar6 = std::
                equal_to<std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>_>
                ::operator()((equal_to<std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>_>
                              *)this,key,
                             (vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                              *)(*(long *)this + lVar11));
        if (bVar6) goto LAB_0026bd0f;
        iVar9 = *(int *)(this + 0x28);
        uVar10 = uVar10 + iVar9;
        lVar8 = *(long *)(this + 8);
        pbVar2 = (byte *)(lVar8 + 1 + insertion_idx);
        insertion_idx = insertion_idx + 1;
        lVar11 = lVar11 + 0x28;
      } while (uVar10 == *pbVar2);
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) break;
    Table<true,_80UL,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_std::shared_ptr<const_Rml::ElementDefinition>,_robin_hood::hash<std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_void>,_std::equal_to<std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>_>_>
    ::increase_size((Table<true,_80UL,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_std::shared_ptr<const_Rml::ElementDefinition>,_robin_hood::hash<std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_void>,_std::equal_to<std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>_>_>
                     *)this);
  }
  if (0xff < iVar9 + uVar10) {
    *(undefined8 *)(this + 0x20) = 0;
  }
  lVar11 = 1;
  do {
    lVar11 = lVar11 + -1;
    pcVar1 = (char *)(lVar8 + insertion_idx);
    lVar8 = lVar8 + 1;
  } while (*pcVar1 != '\0');
  this_01 = (vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_> *)
            (insertion_idx * 0x28 + *(long *)this);
  if (lVar11 == 0) {
    std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>::vector
              (this_01,key);
    this_01[1].
    super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    this_01[1].
    super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    Table<true,_80UL,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_std::shared_ptr<const_Rml::ElementDefinition>,_robin_hood::hash<std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_void>,_std::equal_to<std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>_>_>
    ::shiftUp((Table<true,_80UL,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_std::shared_ptr<const_Rml::ElementDefinition>,_robin_hood::hash<std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_void>,_std::equal_to<std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>_>_>
               *)this,insertion_idx - lVar11,insertion_idx);
    std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>::vector
              (&local_58,key);
    local_40 = 0;
    uStack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ppSVar4 = (this_01->
              super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppSVar5 = (this_01->
              super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this_01->
    super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_58.
         super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this_01->
    super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this_01->
    super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_58.
         super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.
    super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar12 = 0;
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    if (ppSVar4 != (pointer)0x0) {
      operator_delete(ppSVar4,(long)ppSVar5 - (long)ppSVar4);
      uVar12 = (undefined4)local_40;
      uVar13 = local_40._4_4_;
      uVar14 = (undefined4)uStack_38;
      uVar15 = uStack_38._4_4_;
    }
    local_40 = 0;
    uStack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              this_01[1].
              super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    *(undefined4 *)
     &this_01[1].
      super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = uVar12;
    *(undefined4 *)
     ((long)&this_01[1].
             super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = uVar13;
    *(undefined4 *)
     &this_01[1].
      super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = uVar14;
    *(undefined4 *)
     ((long)&this_01[1].
             super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar15;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (uStack_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_38);
      }
    }
    if (local_58.
        super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  *(char *)(*(long *)(this + 8) + insertion_idx) = (char)uVar10;
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
LAB_0026bd0f:
  return (type)(*(long *)this + insertion_idx * 0x28 + 0x18);
}

Assistant:

typename std::enable_if<!std::is_void<Q>::value, Q&>::type doCreateByKey(Arg&& key) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match. Can't do a do-while here because when mInfo is
            // 0 we don't want to skip forward
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do not insert.
                    return mKeyVals[idx].getSecond();
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                // put at empty spot. This forwards all arguments into the node where the object
                // is constructed exactly where it is needed.
                ::new (static_cast<void*>(&l))
                    Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            }

            // mKeyVals[idx].getFirst() = std::move(key);
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return mKeyVals[insertion_idx].getSecond();
        }
    }